

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.c
# Opt level: O0

void X509_PUBKEY_free(X509_PUBKEY *a)

{
  ASN1_ITEM *it;
  
  it = (ASN1_ITEM *)X509_PUBKEY_it();
  ASN1_item_free((ASN1_VALUE *)a,it);
  return;
}

Assistant:

IMPLEMENT_ASN1_FUNCTIONS(X509_PUBKEY)

X509_PUBKEY *X509_PUBKEY_new_ex(OSSL_LIB_CTX *libctx, const char *propq)
{
    X509_PUBKEY *pubkey = NULL;

    pubkey = (X509_PUBKEY *)ASN1_item_new_ex(X509_PUBKEY_it(), libctx, propq);
    if (!x509_pubkey_set0_libctx(pubkey, libctx, propq)) {
        X509_PUBKEY_free(pubkey);
        pubkey = NULL;
    }
    return pubkey;
}